

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::DepthStencilCase::init(DepthStencilCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int height_;
  int depthBits_;
  int stencilBits_;
  int extraout_EAX;
  RenderTarget *pRVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  QuadRenderer *this_00;
  RenderContext *context;
  Surface *this_01;
  TextureLevel *pTVar6;
  ReferenceQuadRenderer *this_02;
  TextureFormat local_4c;
  TextureFormat local_44 [2];
  int local_30;
  int local_2c;
  int ndx_1;
  int ndx;
  int local_20;
  int iStack_1c;
  int local_18;
  int local_14;
  int viewportH;
  int viewportW;
  DepthStencilCase *this_local;
  
  _viewportH = this;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar2);
  local_14 = de::min<int>(iVar1,0x30);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getHeight(pRVar2);
  height_ = de::min<int>(iVar1,0x30);
  iVar1 = local_14;
  local_18 = height_;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  depthBits_ = tcu::RenderTarget::getDepthBits(pRVar2);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  stencilBits_ = tcu::RenderTarget::getStencilBits(pRVar2);
  DepthStencilCaseUtil::TestRenderTarget::TestRenderTarget
            ((TestRenderTarget *)&ndx_1,iVar1,height_,depthBits_,stencilBits_);
  (this->m_renderTarget).width = ndx_1;
  (this->m_renderTarget).height = ndx;
  (this->m_renderTarget).depthBits = local_20;
  (this->m_renderTarget).stencilBits = iStack_1c;
  DepthStencilCaseUtil::generateBaseClearAndDepthCommands
            (&this->m_renderTarget,&this->m_baseClears,&this->m_baseDepthRenders);
  DepthStencilCaseUtil::generateDepthVisualizeCommands
            (&this->m_renderTarget,&this->m_visualizeCommands);
  DepthStencilCaseUtil::generateStencilVisualizeCommands
            (&this->m_renderTarget,&this->m_visualizeCommands);
  sVar3 = std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
          ::size(&this->m_baseDepthRenders);
  std::
  vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::resize(&this->m_refBaseDepthRenders,sVar3);
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    sVar3 = std::
            vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ::size(&this->m_baseDepthRenders);
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::
             vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ::operator[](&this->m_baseDepthRenders,(long)local_2c);
    pvVar5 = std::
             vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ::operator[](&this->m_refBaseDepthRenders,(long)local_2c);
    DepthStencilCaseUtil::translateCommand(pvVar4,pvVar5,&this->m_renderTarget);
    local_2c = local_2c + 1;
  }
  sVar3 = std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
          ::size(&this->m_visualizeCommands);
  std::
  vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::resize(&this->m_refVisualizeCommands,sVar3);
  local_30 = 0;
  while( true ) {
    iVar1 = local_30;
    sVar3 = std::
            vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ::size(&this->m_visualizeCommands);
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::
             vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ::operator[](&this->m_visualizeCommands,(long)local_30);
    pvVar5 = std::
             vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ::operator[](&this->m_refVisualizeCommands,(long)local_30);
    DepthStencilCaseUtil::translateCommand(pvVar4,pvVar5,&this->m_renderTarget);
    local_30 = local_30 + 1;
  }
  this_00 = (QuadRenderer *)operator_new(0x20);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer(this_00,context,GLSL_VERSION_300_ES);
  this->m_renderer = this_00;
  this_01 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(this_01,local_14,local_18);
  this->m_refColorBuffer = this_01;
  pTVar6 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(local_44,D,FLOAT);
  tcu::TextureLevel::TextureLevel(pTVar6,local_44,local_14,local_18,1);
  this->m_refDepthBuffer = pTVar6;
  pTVar6 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(&local_4c,S,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel(pTVar6,&local_4c,local_14,local_18,1);
  this->m_refStencilBuffer = pTVar6;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_refRenderer = this_02;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void DepthStencilCase::init (void)
{
	DE_ASSERT(!m_renderer && !m_refColorBuffer && !m_refDepthBuffer && !m_refStencilBuffer && !m_refRenderer);

	// Compute render target.
	int viewportW	= de::min<int>(m_context.getRenderTarget().getWidth(), VIEWPORT_WIDTH);
	int viewportH	= de::min<int>(m_context.getRenderTarget().getHeight(), VIEWPORT_HEIGHT);
	m_renderTarget	= TestRenderTarget(viewportW, viewportH, m_context.getRenderTarget().getDepthBits(), m_context.getRenderTarget().getStencilBits());

	// Compute base clears & visualization commands.
	generateBaseClearAndDepthCommands(m_renderTarget, m_baseClears, m_baseDepthRenders);
	generateDepthVisualizeCommands(m_renderTarget, m_visualizeCommands);
	generateStencilVisualizeCommands(m_renderTarget, m_visualizeCommands);

	// Translate to ref commands.
	m_refBaseDepthRenders.resize(m_baseDepthRenders.size());
	for (int ndx = 0; ndx < (int)m_baseDepthRenders.size(); ndx++)
		translateCommand(m_baseDepthRenders[ndx], m_refBaseDepthRenders[ndx], m_renderTarget);

	m_refVisualizeCommands.resize(m_visualizeCommands.size());
	for (int ndx = 0; ndx < (int)m_visualizeCommands.size(); ndx++)
		translateCommand(m_visualizeCommands[ndx], m_refVisualizeCommands[ndx], m_renderTarget);

	m_renderer			= new gls::FragmentOpUtil::QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_300_ES);
	m_refColorBuffer	= new tcu::Surface(viewportW, viewportH);
	m_refDepthBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT),			viewportW, viewportH);
	m_refStencilBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT32),	viewportW, viewportH);
	m_refRenderer		= new gls::FragmentOpUtil::ReferenceQuadRenderer();

	m_iterNdx			= 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}